

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

NativeWindowFactory *
eglu::selectNativeWindowFactory(NativeDisplayFactory *factory,CommandLine *cmdLine)

{
  NativeWindowFactoryRegistry *registry;
  char *cmdLineArg;
  NativeWindowFactory *pNVar1;
  CommandLine *cmdLine_local;
  NativeDisplayFactory *factory_local;
  
  registry = NativeDisplayFactory::getNativeWindowRegistry(factory);
  cmdLineArg = tcu::CommandLine::getEGLWindowType(cmdLine);
  pNVar1 = selectFactory<eglu::NativeWindowFactory>(registry,"window",cmdLineArg);
  return pNVar1;
}

Assistant:

const NativeWindowFactory& selectNativeWindowFactory (const NativeDisplayFactory& factory, const tcu::CommandLine& cmdLine)
{
	return selectFactory(factory.getNativeWindowRegistry(), "window", cmdLine.getEGLWindowType());
}